

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O0

char * lib_copy_str(char *str,size_t len)

{
  size_t in_RSI;
  void *in_RDI;
  char *buf;
  size_t in_stack_ffffffffffffffe0;
  char *local_8;
  
  if (in_RDI == (void *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    local_8 = lib_alloc_str(in_stack_ffffffffffffffe0);
    if (local_8 != (char *)0x0) {
      memcpy(local_8,in_RDI,in_RSI);
      local_8[in_RSI] = '\0';
    }
  }
  return local_8;
}

Assistant:

char *lib_copy_str(const char *str, size_t len)
{
    /* if the source string is null, just return null as the result */
    if (str == 0)
        return 0;

    /* allocate space */
    char *buf = lib_alloc_str(len);

    /* if that succeeded, make a copy */
    if (buf != 0)
    {
        /* copy the string */
        memcpy(buf, str, len);

        /* null-terminate it */
        buf[len] = '\0';
    }

    /* return the buffer */
    return buf;
}